

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_shader_precision_format
               (NegativeTestContext *ctx)

{
  ostringstream *this;
  char *pcVar1;
  GLboolean shaderCompilerSupported;
  allocator<char> local_1ad;
  GLint precision [1];
  GLint range [2];
  undefined1 local_1a0 [384];
  
  glu::CallLogWrapper::glGetBooleanv(&ctx->super_CallLogWrapper,0x8dfa,&shaderCompilerSupported);
  local_1a0._0_8_ = (ctx->super_CallLogWrapper).m_log;
  this = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((ostream *)this,"// GL_SHADER_COMPILER = ");
  pcVar1 = "mapped_ == GL_TRUE";
  if (shaderCompilerSupported == '\0') {
    pcVar1 = "mapped_ == GL_FALSE";
  }
  std::operator<<((ostream *)this,pcVar1 + 0xb);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  range[0] = -0x32323233;
  range[1] = -0x32323233;
  precision[0] = -0x32323233;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a0,
             "GL_INVALID_ENUM is generated if shaderType or precisionType is not an accepted value."
             ,&local_1ad);
  NegativeTestContext::beginSection(ctx,(string *)local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  glu::CallLogWrapper::glGetShaderPrecisionFormat
            (&ctx->super_CallLogWrapper,0xffffffff,0x8df1,range,precision);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glGetShaderPrecisionFormat
            (&ctx->super_CallLogWrapper,0x8b31,0xffffffff,range,precision);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glGetShaderPrecisionFormat
            (&ctx->super_CallLogWrapper,0xffffffff,0xffffffff,range,precision);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void get_shader_precision_format (NegativeTestContext& ctx)
{
	GLboolean	shaderCompilerSupported;
	GLint		range[2];
	GLint		precision[1];

	ctx.glGetBooleanv(GL_SHADER_COMPILER, &shaderCompilerSupported);
	ctx.getLog() << TestLog::Message << "// GL_SHADER_COMPILER = " << (shaderCompilerSupported ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;

	deMemset(&range[0], 0xcd, sizeof(range));
	deMemset(&precision[0], 0xcd, sizeof(precision));

	ctx.beginSection("GL_INVALID_ENUM is generated if shaderType or precisionType is not an accepted value.");
	ctx.glGetShaderPrecisionFormat (-1, GL_MEDIUM_FLOAT, &range[0], &precision[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetShaderPrecisionFormat (GL_VERTEX_SHADER, -1, &range[0], &precision[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetShaderPrecisionFormat (-1, -1, &range[0], &precision[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}